

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstring_agg.cpp
# Opt level: O3

idx_t duckdb::BitStringAggOperation::GetRange<duckdb::hugeint_t>(hugeint_t min,hugeint_t max)

{
  bool bVar1;
  idx_t iVar2;
  hugeint_t hVar3;
  hugeint_t input;
  idx_t range;
  hugeint_t result;
  idx_t local_40;
  hugeint_t local_38;
  hugeint_t local_28;
  hugeint_t local_18;
  
  bVar1 = TrySubtractOperator::Operation<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::hugeint_t>
                    (max,min,&local_38);
  iVar2 = 0xffffffffffffffff;
  if (bVar1) {
    hugeint_t::hugeint_t(&local_18,1);
    hVar3 = hugeint_t::operator+(&local_38,&local_18);
    input.upper = (int64_t)&local_40;
    input.lower = hVar3.upper;
    bVar1 = Hugeint::TryCast<unsigned_long>((Hugeint *)hVar3.lower,input,&local_40);
    iVar2 = 0xffffffffffffffff;
    if (bVar1) {
      local_28.lower = 0xffffffffffffffff;
      local_28.upper = 0x7fffffffffffffff;
      bVar1 = hugeint_t::operator==(&local_38,&local_28);
      if (!bVar1) {
        iVar2 = local_40;
      }
    }
  }
  return iVar2;
}

Assistant:

idx_t BitStringAggOperation::GetRange(hugeint_t min, hugeint_t max) {
	hugeint_t result;
	if (!TrySubtractOperator::Operation(max, min, result)) {
		return NumericLimits<idx_t>::Maximum();
	}
	idx_t range;
	if (!Hugeint::TryCast(result + 1, range) || result == NumericLimits<hugeint_t>::Maximum()) {
		return NumericLimits<idx_t>::Maximum();
	}
	return range;
}